

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::dropUpTo
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  uint uVar1;
  byte in_CL;
  undefined7 in_register_00000011;
  VerySimpleReadOnlyString *needle;
  undefined8 extraout_RDX;
  VerySimpleReadOnlyString VVar2;
  int local_68;
  int local_64;
  uint local_54;
  tCharPtr local_48;
  uint pos;
  bool includeFind_local;
  VerySimpleReadOnlyString *find_local;
  VerySimpleReadOnlyString *this_local;
  
  needle = (VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind);
  uVar1 = Find(find,needle,0);
  if (uVar1 == find->length) {
    local_48 = find->data;
  }
  else {
    local_54 = uVar1;
    if ((in_CL & 1) == 0) {
      local_54 = uVar1 + needle->length;
    }
    local_48 = find->data + local_54;
  }
  if (uVar1 == find->length) {
    local_64 = find->length;
  }
  else {
    if ((in_CL & 1) == 0) {
      local_68 = (find->length - uVar1) - needle->length;
    }
    else {
      local_68 = find->length - uVar1;
    }
    local_64 = local_68;
  }
  VerySimpleReadOnlyString(this,local_48,local_64);
  VVar2._8_8_ = extraout_RDX;
  VVar2.data = (tCharPtr)this;
  return VVar2;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::dropUpTo(const VerySimpleReadOnlyString & find, const bool includeFind) const
	{
	    const unsigned int pos = Find(find);
	    return VerySimpleReadOnlyString(pos == (unsigned int)length ? data : &data[includeFind ? pos : pos + (unsigned int)find.length],
	                                    pos == (unsigned int)length ? (unsigned int)length : (includeFind ? (unsigned int)length - pos
	                                                                  : (unsigned int)length - pos - (unsigned int)find.length));
	}